

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rom2snsf.cpp
# Opt level: O0

bool rom2snsf(char *rom_path,char *snsf_path,uint32_t load_offset,
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             *tags)

{
  bool bVar1;
  ulong __n;
  uint8_t *buf;
  FILE *__stream;
  size_t sVar2;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_150;
  allocator local_119;
  string local_118 [48];
  undefined1 local_e8 [8];
  ZlibWriter zlib_exe;
  FILE *rom_file;
  uint8_t *exe;
  size_t rom_size;
  off_t off_rom_size;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *tags_local;
  uint32_t load_offset_local;
  char *snsf_path_local;
  char *rom_path_local;
  
  __n = path_getfilesize(rom_path);
  if (__n == 0xffffffffffffffff) {
    fprintf(_stderr,"Error: File not found \"%s\"\n",rom_path);
    rom_path_local._7_1_ = false;
  }
  else if (__n < 0x800001) {
    buf = (uint8_t *)malloc(__n + 8);
    if (buf == (uint8_t *)0x0) {
      fprintf(_stderr,"Error: Memory allocation error\n");
      rom_path_local._7_1_ = false;
    }
    else {
      writeInt(buf,load_offset);
      writeInt(buf + 4,(uint32_t)__n);
      __stream = fopen(rom_path,"rb");
      zlib_exe._144_8_ = __stream;
      if (__stream == (FILE *)0x0) {
        fprintf(_stderr,"Error: File open error \"%s\"\n",rom_path);
        free(buf);
        rom_path_local._7_1_ = false;
      }
      else {
        sVar2 = fread(buf + 8,1,__n,__stream);
        if (sVar2 == __n) {
          fclose((FILE *)zlib_exe._144_8_);
          ZlibWriter::ZlibWriter((ZlibWriter *)local_e8,9);
          ZlibWriter::write((ZlibWriter *)local_e8,(int)buf,(void *)(__n + 8),(size_t)__stream);
          std::allocator<char>::allocator();
          std::__cxx11::string::string(local_118,snsf_path,&local_119);
          std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::map(&local_150,tags);
          bVar1 = PSFFile::save((string *)local_118,'#',(uint8_t *)0x0,0,(ZlibWriter *)local_e8,
                                &local_150);
          std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::~map(&local_150);
          std::__cxx11::string::~string(local_118);
          std::allocator<char>::~allocator((allocator<char> *)&local_119);
          bVar1 = ((bVar1 ^ 0xffU) & 1) != 0;
          if (bVar1) {
            fprintf(_stderr,"Error: File write error \"%s\"\n",snsf_path);
            free(buf);
          }
          else {
            free(buf);
          }
          rom_path_local._7_1_ = !bVar1;
          ZlibWriter::~ZlibWriter((ZlibWriter *)local_e8);
        }
        else {
          fprintf(_stderr,"Error: File read error \"%s\"\n",rom_path);
          fclose((FILE *)zlib_exe._144_8_);
          free(buf);
          rom_path_local._7_1_ = false;
        }
      }
    }
  }
  else {
    fprintf(_stderr,"Error: File too large \"%s\"\n",rom_path);
    rom_path_local._7_1_ = false;
  }
  return rom_path_local._7_1_;
}

Assistant:

bool rom2snsf(const char * rom_path, const char * snsf_path, uint32_t load_offset, const std::map<std::string, std::string> & tags)
{
	off_t off_rom_size = path_getfilesize(rom_path);
	if (off_rom_size == -1) {
		fprintf(stderr, "Error: File not found \"%s\"\n", rom_path);
		return false;
	}

	size_t rom_size = off_rom_size;
	if (rom_size > SNES_ROM_MAX_SIZE) {
		fprintf(stderr, "Error: File too large \"%s\"\n", rom_path);
		return false;
	}

	uint8_t * exe = (uint8_t *)malloc(SNSF_EXE_HEADER_SIZE + rom_size);
	if (exe == NULL) {
		fprintf(stderr, "Error: Memory allocation error\n");
		return false;
	}
	writeInt(&exe[0], load_offset);
	writeInt(&exe[4], (uint32_t)rom_size);

	FILE * rom_file = fopen(rom_path, "rb");
	if (rom_file == NULL) {
		fprintf(stderr, "Error: File open error \"%s\"\n", rom_path);
		free(exe);
		return false;
	}

	if (fread(&exe[8], 1, rom_size, rom_file) != rom_size) {
		fprintf(stderr, "Error: File read error \"%s\"\n", rom_path);
		fclose(rom_file);
		free(exe);
		return false;
	}

	fclose(rom_file);

	ZlibWriter zlib_exe(Z_BEST_COMPRESSION);
	zlib_exe.write(exe, SNSF_EXE_HEADER_SIZE + rom_size);

	if (!PSFFile::save(snsf_path, SNSF_PSF_VERSION, NULL, 0, zlib_exe, tags)) {
		fprintf(stderr, "Error: File write error \"%s\"\n", snsf_path);
		free(exe);
		return false;
	}

	free(exe);

	return true;
}